

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O2

void __thiscall
BayesianGameCollaborativeGraphical::SetUtility
          (BayesianGameCollaborativeGraphical *this,Index e,Index jtI_e,Index jaI_e,double ut)

{
  reference ppBVar1;
  
  ppBVar1 = std::
            vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>::
            at(&this->_m_LRFs,(ulong)e);
  (*((*ppBVar1)->_m_utilFunction->super_QTableInterface)._vptr_QTableInterface[1])
            (ut,(*ppBVar1)->_m_utilFunction,(ulong)jtI_e,(ulong)jaI_e);
  return;
}

Assistant:

void 
BayesianGameCollaborativeGraphical::
SetUtility(Index e, 
        const std::vector< Index >& indTypes_e, 
        const std::vector< Index >& actions_e,
        double ut)
{ _m_LRFs.at(e)->SetUtility(indTypes_e, actions_e, ut); }